

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::LdexpCaseInstance::compare
          (LdexpCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  float fVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  ostringstream *this_00;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  deUint32 u32;
  deUint32 bBits;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = *(uint *)((long)&(pSVar3->varType).m_data + 4);
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  bVar16 = (int)uVar4 < 1;
  if (0 < (int)uVar4) {
    fVar13 = (float)~(-1 << (0x17 - (&DAT_00b8730c)[(ulong)uVar11 * 4] & 0x1f));
    uVar15 = 0;
    do {
      fVar1 = *(float *)((long)*inputs + uVar15 * 4);
      iVar7 = *(int *)((long)inputs[1] + uVar15 * 4);
      if (fVar1 == 0.0 && iVar7 == 0) {
        fVar9 = (float)((uint)fVar1 & 0x80000000);
      }
      else {
        bVar17 = ((uint)fVar1 & 0x7f800000) != 0;
        uVar11 = (uint)fVar1 & 0x7fffff;
        bVar18 = uVar11 == 0;
        iVar6 = -0x7e;
        if (bVar18 || bVar17) {
          iVar6 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7f;
        }
        iVar6 = iVar6 + iVar7;
        uVar10 = iVar6 * 0x800000 + 0x3f800000;
        uVar14 = uVar10;
        if (iVar6 == -0x7e) {
          uVar14 = 0;
        }
        uVar8 = uVar11 + 0x800000;
        if (fVar1 == 0.0 || !bVar18 && !bVar17) {
          uVar8 = uVar11;
        }
        if (fVar1 != 0.0 && (bVar18 || bVar17)) {
          uVar14 = uVar10;
        }
        if (uVar8 == 0 && iVar6 == 0) {
          uVar14 = 0;
        }
        fVar9 = (float)((uint)fVar1 & 0x807fffff | uVar14);
      }
      fVar2 = *(float *)((long)*outputs + uVar15 * 4);
      if (((fVar2 == 0.0) && (fVar12 = fVar9, !NAN(fVar2))) ||
         ((fVar9 == 0.0 && (fVar12 = fVar2, !NAN(fVar9))))) {
        fVar12 = ABS(fVar12);
      }
      else {
        fVar12 = (float)((int)fVar9 - (int)fVar2);
        if ((uint)fVar9 < (uint)fVar2) {
          fVar12 = (float)-((int)fVar9 - (int)fVar2);
        }
      }
      if ((uint)fVar13 < (uint)fVar12) {
        iVar6 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7f;
        iVar7 = -0x7e;
        if (((uint)fVar1 & 0x7fffff) == 0) {
          iVar7 = iVar6;
        }
        if (((uint)fVar1 & 0x7f800000) != 0) {
          iVar7 = iVar6;
        }
        this_00 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
        local_34.value = fVar9;
        poVar5 = anon_unknown_0::operator<<(poVar5,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", (exp = ",9);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") with ULP threshold ",0x15);
        local_40.value = (deUint64)(uint)fVar13;
        poVar5 = tcu::Format::Hex<8UL>::toStream(&local_40,poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ULP diff ",0xf);
        local_40.value = (deUint64)(uint)fVar12;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar5);
        return bVar16;
      }
      uVar15 = uVar15 + 1;
      bVar16 = uVar4 <= uVar15;
    } while (uVar15 != uVar4);
  }
  return bVar16;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const int		in1			= ((const int*)inputs[1])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		refOut0		= ldexp(in0, in1);
			const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, refOut0);

			const int		inExp		= tcu::Float32(in0).exponent();

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", (exp = " << inExp << ") with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}